

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ImportWriteProtection.cpp
# Opt level: O1

bool axl::spy::restoreImportWriteProtection(ImportWriteProtectionBackup *backup)

{
  byte bVar1;
  int iVar2;
  
  if (backup->m_p != (void *)0x0) {
    bVar1 = *(byte *)&backup->field_2 << 4;
    iVar2 = mprotect(backup->m_p,backup->m_size,
                     (uint)((byte)((bVar1 | *(byte *)&backup->field_2 >> 4) * '\x02' & 0x40 |
                                  ((bVar1 & 0x10) << 2 | (bVar1 & 0x40) >> 2) * '\x02') >> 5));
    return iVar2 != -1;
  }
  return true;
}

Assistant:

bool
restoreImportWriteProtection(const ImportWriteProtectionBackup* backup) {
	if (!backup->m_p) // nothing to restore
		return true;

	int prot = 0;

	if (backup->m_flags & PF_R)
		prot |= PROT_READ;

	if (backup->m_flags & PF_W)
		prot |= PROT_WRITE;

	if (backup->m_flags & PF_X)
		prot |= PROT_EXEC;

	int result = ::mprotect(backup->m_p, backup->m_size, prot);
	return result != -1;
}